

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_audio.cpp
# Opt level: O3

void __thiscall cubeb_run_volume_test_float_Test::TestBody(cubeb_run_volume_test_float_Test *this)

{
  bool bVar1;
  stringstream *this_00;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  char local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  local_30.ptr_._0_4_ = run_volume_test(1);
  local_28.data_._0_4_ = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (local_20,"run_volume_test(1)",(int *)&local_30,(anon_enum_32 *)&local_28);
  if (local_20[0] == '\0') {
    this_00 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_00);
    *(undefined8 *)(this_00 + *(long *)(*(long *)(this_00 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    local_30.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_audio.cpp"
               ,0xd8,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cubeb, run_volume_test_float)
{
  ASSERT_EQ(run_volume_test(1), CUBEB_OK);
}